

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

var cs::make_cni<void(&)(std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&)>
              (_func_void_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr *func,
              bool request_fold)

{
  byte in_DL;
  proxy *in_RDI;
  _func_void_shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_ptr *in_stack_ffffffffffffffa8;
  types *args_1;
  cni *in_stack_ffffffffffffffc8;
  types local_20 [3];
  byte local_11;
  
  local_11 = in_DL & 1;
  args_1 = local_20;
  cs_impl::cni::cni<void(&)(std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>const&)>
            ((cni *)in_RDI,in_stack_ffffffffffffffa8);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            (in_stack_ffffffffffffffc8,args_1);
  cs_impl::cni::~cni((cni *)in_RDI);
  return (var)in_RDI;
}

Assistant:

var make_cni(T &&func, bool request_fold = false)
	{
		return var::make_protect<callable>(cni(func),
		                                   request_fold ? callable::types::request_fold : callable::types::normal);
	}